

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O0

VRMatrix4 * MinVR::VRMatrix4::rotation(VRPoint3 *p,VRVector3 *v,float a)

{
  VRVector3 *in_RDX;
  VRPoint3 *in_RSI;
  VRMatrix4 *in_RDI;
  float fVar1;
  double dVar2;
  VRMatrix4 transBack;
  VRMatrix4 invB;
  VRMatrix4 invA;
  VRMatrix4 C;
  VRMatrix4 B;
  VRMatrix4 A;
  VRMatrix4 transToOrigin;
  float phi;
  float theta;
  float vX;
  float vZ;
  undefined4 in_stack_fffffffffffffbe0;
  float in_stack_fffffffffffffbe4;
  VRMatrix4 *this;
  float in_stack_fffffffffffffc28;
  float in_stack_fffffffffffffc2c;
  VRMatrix4 *in_stack_fffffffffffffc40;
  VRMatrix4 *in_stack_fffffffffffffc48;
  VRMatrix4 local_3a0;
  VRMatrix4 local_358;
  VRMatrix4 local_310;
  VRMatrix4 local_2c8;
  VRVector3 local_280;
  VRMatrix4 local_268;
  VRMatrix4 local_220;
  VRMatrix4 local_1d8;
  VRMatrix4 local_190;
  VRMatrix4 local_148;
  VRMatrix4 local_100;
  VRVector3 local_a8;
  VRVector3 local_90;
  VRMatrix4 local_78;
  uint local_2c;
  undefined4 local_28;
  float local_24;
  float local_20;
  VRVector3 *local_18;
  VRPoint3 *local_10;
  
  this = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = VRVector3::operator[](in_RDX,2);
  local_24 = VRVector3::operator[](local_18,0);
  dVar2 = std::atan2((double)(ulong)(uint)local_20,(double)(ulong)(uint)local_24);
  local_28 = SUB84(dVar2,0);
  fVar1 = VRVector3::operator[](local_18,1);
  dVar2 = std::sqrt((double)(ulong)(uint)(local_24 * local_24 + local_20 * local_20));
  dVar2 = std::atan2((double)(ulong)(uint)fVar1,dVar2);
  local_2c = SUB84(dVar2,0) ^ 0x80000000;
  VRPoint3::operator[](local_10,0);
  VRPoint3::operator[](local_10,1);
  VRPoint3::operator[](local_10,2);
  VRVector3::VRVector3
            ((VRVector3 *)this,(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),
             in_stack_fffffffffffffbe4);
  MinVR::operator*((float)((ulong)in_RDI >> 0x20),
                   (VRVector3 *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
  translation((VRVector3 *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  VRVector3::~VRVector3(&local_90);
  VRVector3::~VRVector3(&local_a8);
  rotationY(in_stack_fffffffffffffc2c);
  rotationZ(in_stack_fffffffffffffc2c);
  rotationX(in_stack_fffffffffffffc2c);
  rotationY(in_stack_fffffffffffffc2c);
  rotationZ(in_stack_fffffffffffffc2c);
  fVar1 = VRPoint3::operator[](local_10,0);
  VRPoint3::operator[](local_10,1);
  VRPoint3::operator[](local_10,2);
  VRVector3::VRVector3((VRVector3 *)this,(float)((ulong)in_RDI >> 0x20),SUB84(in_RDI,0),fVar1);
  translation((VRVector3 *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
  VRVector3::~VRVector3(&local_280);
  MinVR::operator*(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  MinVR::operator*(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  MinVR::operator*(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  MinVR::operator*(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  MinVR::operator*(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  MinVR::operator*(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  ~VRMatrix4(&local_2c8);
  ~VRMatrix4(&local_310);
  ~VRMatrix4(&local_358);
  ~VRMatrix4(&local_3a0);
  ~VRMatrix4((VRMatrix4 *)&stack0xfffffffffffffc18);
  ~VRMatrix4(&local_268);
  ~VRMatrix4(&local_220);
  ~VRMatrix4(&local_1d8);
  ~VRMatrix4(&local_190);
  ~VRMatrix4(&local_148);
  ~VRMatrix4(&local_100);
  ~VRMatrix4(&local_78);
  return this;
}

Assistant:

VRMatrix4 VRMatrix4::rotation(const VRPoint3& p, const VRVector3& v, const float a) {
  // Translate to origin from point p
  const float vZ = v[2];
  const float vX = v[0];
  const float theta = atan2(vZ, vX);
  const float phi   = -atan2((float)v[1], (float)sqrt(vX * vX + vZ * vZ));

  const VRMatrix4 transToOrigin = VRMatrix4::translation(-1.0*VRVector3(p[0], p[1], p[2]));
  const VRMatrix4 A = VRMatrix4::rotationY(theta);
  const VRMatrix4 B = VRMatrix4::rotationZ(phi);
  const VRMatrix4 C = VRMatrix4::rotationX(a);
  const VRMatrix4 invA = VRMatrix4::rotationY(-theta);
  const VRMatrix4 invB = VRMatrix4::rotationZ(-phi);
  const VRMatrix4 transBack = VRMatrix4::translation(VRVector3(p[0], p[1], p[2]));
  
  return transBack * invA * invB * C * B * A * transToOrigin;
}